

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmReturn(ExpressionContext *ctx,VmModule *module,ExprReturn *node)

{
  VmValue *pVVar1;
  VmValue *value;
  ExprReturn *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  pVVar1 = CompileVm(ctx,module,node->value);
  if (node->coroutineStateUpdate != (ExprBase *)0x0) {
    CompileVm(ctx,module,node->coroutineStateUpdate);
  }
  if (node->closures != (ExprBase *)0x0) {
    CompileVm(ctx,module,node->closures);
  }
  if (node->value->type == ctx->typeVoid) {
    pVVar1 = anon_unknown.dwarf_c91b1::CreateReturn(module,(node->super_ExprBase).source);
    ctx_local = (ExpressionContext *)
                anon_unknown.dwarf_c91b1::CheckType(ctx,&node->super_ExprBase,pVVar1);
  }
  else {
    pVVar1 = anon_unknown.dwarf_c91b1::CreateReturn(module,(node->super_ExprBase).source,pVVar1);
    ctx_local = (ExpressionContext *)
                anon_unknown.dwarf_c91b1::CheckType(ctx,&node->super_ExprBase,pVVar1);
  }
  return (VmValue *)ctx_local;
}

Assistant:

VmValue* CompileVmReturn(ExpressionContext &ctx, VmModule *module, ExprReturn *node)
{
	VmValue *value = CompileVm(ctx, module, node->value);

	if(node->coroutineStateUpdate)
		CompileVm(ctx, module, node->coroutineStateUpdate);

	if(node->closures)
		CompileVm(ctx, module, node->closures);

	if(node->value->type == ctx.typeVoid)
		return CheckType(ctx, node, CreateReturn(module, node->source));

	return CheckType(ctx, node, CreateReturn(module, node->source, value));
}